

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Double_Window.cxx
# Opt level: O2

void __thiscall Fl_Double_Window::resize(Fl_Double_Window *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  Fl_X *pFVar3;
  
  iVar1 = (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_;
  iVar2 = (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_;
  Fl_Window::resize(&this->super_Fl_Window,X,Y,W,H);
  pFVar3 = (this->super_Fl_Window).i;
  if (use_xdbe == '\x01') {
    if (pFVar3 == (Fl_X *)0x0) {
      return;
    }
    if (pFVar3->other_xid == 0) {
      return;
    }
    if (((this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_ <= iVar1) &&
       ((this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_ <= iVar2)) {
      return;
    }
    XdbeDeallocateBackBufferName(fl_display);
  }
  else {
    if (pFVar3 == (Fl_X *)0x0) {
      return;
    }
    if (pFVar3->other_xid == 0) {
      return;
    }
    if ((iVar1 == (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_) &&
       (iVar2 == (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_)) {
      return;
    }
    XFreePixmap(fl_display);
  }
  pFVar3->other_xid = 0;
  return;
}

Assistant:

void Fl_Double_Window::resize(int X,int Y,int W,int H) {
  int ow = w();
  int oh = h();
  Fl_Window::resize(X,Y,W,H);
#if USE_XDBE
  if (use_xdbe) {
    Fl_X* myi = Fl_X::i(this);
    if (myi && myi->other_xid && (ow < w() || oh < h())) {
      // STR #2152: Deallocate the back buffer to force creation of a new one.
      XdbeDeallocateBackBufferName(fl_display,myi->other_xid);
      myi->other_xid = 0;
    }
    return;
  }
#endif
  Fl_X* myi = Fl_X::i(this);
  if (myi && myi->other_xid && (ow != w() || oh != h())) {
    fl_delete_offscreen(myi->other_xid);
    myi->other_xid = 0;
  }
}